

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alloc_ref)

{
  void *pvVar1;
  slot_type *old_slot;
  ulong uVar2;
  ctrl_t *pcVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  
  if (7 < this->old_capacity_) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x82e,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    pvVar1 = (c->heap_or_soo_).heap.slot_array.p;
    old_slot = (slot_type *)old_slots(this);
    uVar2 = this->old_capacity_;
    uVar5 = uVar2 >> 1;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      pcVar3 = old_ctrl(this);
      if (kSentinel < pcVar3[uVar4]) {
        map_slot_policy<std::__cxx11::string,std::__cxx11::string>::
        transfer<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  (alloc_ref,(slot_type *)((uVar4 ^ uVar5 + 1) * 0x40 + (long)pvVar1),old_slot);
      }
      uVar2 = this->old_capacity_;
      old_slot = old_slot + 1;
    }
    return;
  }
  __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x82f,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    assert(old_capacity_ < Group::kWidth / 2);
    assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    assert(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array());
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());

    size_t shuffle_bit = old_capacity_ / 2 + 1;
    for (size_t i = 0; i < old_capacity_; ++i) {
      if (IsFull(old_ctrl()[i])) {
        size_t new_i = i ^ shuffle_bit;
        SanitizerUnpoisonMemoryRegion(new_slots + new_i, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots + new_i,
                               old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }